

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetInteger64Verifier::verifyBoolean
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,bool reference)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  long *plVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1c0;
  long local_40;
  GLint64 expectedGLState;
  StateQueryMemoryWriteGuard<long> state;
  bool reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  state.m_postguard._3_1_ = reference;
  state.m_postguard._4_4_ = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long> *)&expectedGLState);
  pname = state.m_postguard._4_4_;
  plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                     ((StateQueryMemoryWriteGuard<long> *)&expectedGLState);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,pname,plVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long> *)&expectedGLState,testCtx);
  if (bVar1) {
    local_40 = (long)(int)(uint)((state.m_postguard._3_1_ & 1) != 0);
    plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                       ((StateQueryMemoryWriteGuard *)&expectedGLState);
    if (*plVar3 != local_40) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [20])"// ERROR: expected ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_40);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyBoolean (tcu::TestContext& testCtx, GLenum name, bool reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLint64 expectedGLState = reference ? 1 : 0;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << expectedGLState << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}